

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O3

void writeTiledRgbaONE1(char *fileName,Rgba *pixels,int width,int height,int tileWidth,
                       int tileHeight)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  TiledRgbaOutputFile out;
  undefined8 local_38;
  
  local_38 = 0;
  uVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,0x3f800000,&out,fileName,width,height,tileWidth,
             tileHeight,0,0,0xf,&local_38,0,3,uVar3);
  Imf_3_4::TiledRgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)pixels,1);
  iVar4 = (int)&out;
  iVar1 = Imf_3_4::TiledRgbaOutputFile::numXTiles(iVar4);
  iVar2 = Imf_3_4::TiledRgbaOutputFile::numYTiles(iVar4);
  Imf_3_4::TiledRgbaOutputFile::writeTiles(iVar4,0,iVar1 + -1,0,iVar2 + -1);
  Imf_3_4::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
  return;
}

Assistant:

void
writeTiledRgbaONE1 (
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height,
    int         tileWidth,
    int         tileHeight)
{
    //
    // Write a tiled image with one level using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,  // tile size
        ONE_LEVEL,   // level mode
        ROUND_DOWN,  // rounding mode
        WRITE_RGBA); // channels in file

    out.setFrameBuffer (pixels, 1, width);
    out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
}